

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

string * __thiscall
inja::Parser::parse_filename_abi_cxx11_(string *__return_storage_ptr__,Parser *this)

{
  size_type sVar1;
  string_view *this_00;
  allocator<char> local_101;
  basic_string_view<char,_std::char_traits<char>_> local_100;
  allocator<char> local_e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  Parser *local_18;
  Parser *this_local;
  
  local_18 = this;
  this_local = (Parser *)__return_storage_ptr__;
  if ((this->tok).kind != String) {
    Token::describe_abi_cxx11_(&local_78,&this->tok);
    ::std::operator+(&local_58,"expected string, got \'",&local_78);
    ::std::operator+(&local_38,&local_58,"\'");
    throw_parser_error(this,&local_38);
    ::std::__cxx11::string::~string((string *)&local_38);
    ::std::__cxx11::string::~string((string *)&local_58);
    ::std::__cxx11::string::~string((string *)&local_78);
  }
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::length(&(this->tok).text);
  if (sVar1 < 2) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_e8,&(this->tok).text,&local_e9);
    ::std::operator+(&local_c8,"expected filename, got \'",&local_e8);
    ::std::operator+(&local_a8,&local_c8,"\'");
    throw_parser_error(this,&local_a8);
    ::std::__cxx11::string::~string((string *)&local_a8);
    ::std::__cxx11::string::~string((string *)&local_c8);
    ::std::__cxx11::string::~string((string *)&local_e8);
    ::std::allocator<char>::~allocator(&local_e9);
  }
  this_00 = &(this->tok).text;
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::length(this_00);
  local_100 = std::basic_string_view<char,_std::char_traits<char>_>::substr(this_00,1,sVar1 - 2);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)__return_storage_ptr__,&local_100,&local_101);
  ::std::allocator<char>::~allocator(&local_101);
  return __return_storage_ptr__;
}

Assistant:

std::string parse_filename() const {
    if (tok.kind != Token::Kind::String) {
      throw_parser_error("expected string, got '" + tok.describe() + "'");
    }

    if (tok.text.length() < 2) {
      throw_parser_error("expected filename, got '" + static_cast<std::string>(tok.text) + "'");
    }

    // Remove first and last character ""
    return std::string {tok.text.substr(1, tok.text.length() - 2)};
  }